

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

void fmt::v5::internal::
     value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
     ::format_custom_arg<bidfx_public_api::price::pixie::PriceSync>
               (void *arg,
               basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>
               *ctx)

{
  undefined8 this;
  basic_parse_context<char,_fmt::v5::internal::error_handler> *ctx_00;
  iterator it;
  iterator it_00;
  basic_parse_context<char,_fmt::v5::internal::error_handler> *parse_ctx;
  type f;
  basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>
  *ctx_local;
  void *arg_local;
  
  f.super_formatter<fmt::v5::basic_string_view<char>,_char,_void>.specs_.precision_ref.field_1.name.
  size_ = (size_t)ctx;
  formatter<bidfx_public_api::price::pixie::PriceSync,_char,_void>::formatter
            ((formatter<bidfx_public_api::price::pixie::PriceSync,_char,_void> *)&parse_ctx);
  ctx_00 = context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
           ::parse_context((context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
                            *)f.super_formatter<fmt::v5::basic_string_view<char>,_char,_void>.specs_
                              .precision_ref.field_1.name.size_);
  it = formatter<fmt::v5::basic_string_view<char>,char,void>::
       parse<fmt::v5::basic_parse_context<char,fmt::v5::internal::error_handler>>
                 ((formatter<fmt::v5::basic_string_view<char>,char,void> *)&parse_ctx,ctx_00);
  basic_parse_context<char,_fmt::v5::internal::error_handler>::advance_to(ctx_00,it);
  this = f.super_formatter<fmt::v5::basic_string_view<char>,_char,_void>.specs_.precision_ref.
         field_1.name.size_;
  it_00 = formatter<bidfx_public_api::price::pixie::PriceSync,char,void>::
          format<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                    ((formatter<bidfx_public_api::price::pixie::PriceSync,char,void> *)&parse_ctx,
                     (PriceSync *)arg,
                     (basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>
                      *)f.super_formatter<fmt::v5::basic_string_view<char>,_char,_void>.specs_.
                        precision_ref.field_1.name.size_);
  context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
  ::advance_to((context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
                *)this,it_00);
  return;
}

Assistant:

static void format_custom_arg(const void *arg, Context &ctx) {
    // Get the formatter type through the context to allow different contexts
    // have different extension points, e.g. `formatter<T>` for `format` and
    // `printf_formatter<T>` for `printf`.
    typename Context::template formatter_type<T>::type f;
    auto &&parse_ctx = ctx.parse_context();
    parse_ctx.advance_to(f.parse(parse_ctx));
    ctx.advance_to(f.format(*static_cast<const T*>(arg), ctx));
  }